

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O2

void __thiscall BoardView::SearchCompoundNoClear(BoardView *this,char *item)

{
  bool bVar1;
  
  if (*item != '\0') {
    if (this->debug == true) {
      fprintf(_stderr,"Searching for \'%s\'\n",item);
    }
    if (this->m_searchComponents == true) {
      FindComponentNoClear(this,item);
    }
    if (this->m_searchNets == true) {
      FindNetNoClear(this,item);
    }
    if (((this->m_partHighlighted).
         super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         (this->m_partHighlighted).
         super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) &&
       ((this->m_pinHighlighted).
        super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (this->m_pinHighlighted).
        super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>._M_impl.
        super__Vector_impl_data._M_finish)) {
      bVar1 = AnyItemVisible(this);
      if (!bVar1) {
        FlipBoard(this,1);
        return;
      }
    }
  }
  return;
}

Assistant:

void BoardView::SearchCompoundNoClear(const char *item) {
	if (*item == '\0') return;
	if (debug) fprintf(stderr, "Searching for '%s'\n", item);
	if (m_searchComponents) FindComponentNoClear(item);
	if (m_searchNets) FindNetNoClear(item);
	if (!m_partHighlighted.empty() && !m_pinHighlighted.empty() && !AnyItemVisible())
		FlipBoard(1); // passing 1 to override flipBoard parameter
}